

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

int __thiscall
Lib::
DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::remove(DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this,char *__filename)

{
  Entry *e;
  pair<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>_>
  *in_stack_ffffffffffffff88;
  DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffff90;
  pair<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>_>
  *this_00;
  pair<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>_>
  local_40 [2];
  Entry *local_20;
  char *local_10;
  DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_8;
  
  local_10 = __filename;
  local_8 = this;
  local_20 = findEntry(in_stack_ffffffffffffff90,&in_stack_ffffffffffffff88->first);
  if (local_20 == (Entry *)0x0) {
    memset(this,0,0x18);
    Option<std::pair<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>_>_>
    ::Option((Option<std::pair<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>_>_>
              *)0x846a6c);
  }
  else {
    (local_20->field_0)._infoData = (local_20->field_0)._infoData | 1;
    *(int *)(__filename + 4) = *(int *)(__filename + 4) + -1;
    *(int *)(__filename + 8) = *(int *)(__filename + 8) + 1;
    local_40[0].second._M_t.
    super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>._M_t.
    super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>.
    super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl =
         (__uniq_ptr_data<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>,_true,_true>
         )move_if_value<Kernel::Unit_*,_true>(&local_20->_key);
    this_00 = local_40;
    move_if_value<std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_true>
              ((unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_> *)
               in_stack_ffffffffffffff88);
    std::
    pair<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>_>
    ::
    pair<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_true>
              (this_00,&in_stack_ffffffffffffff88->first,
               (unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_> *)
               0x846ad1);
    some<std::pair<Kernel::Unit*,std::unique_ptr<Lib::InferenceExtra,std::default_delete<Lib::InferenceExtra>>>>
              (in_stack_ffffffffffffff88);
    std::
    pair<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>_>
    ::~pair((pair<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>_>
             *)0x846aee);
    std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>::~unique_ptr
              ((unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_> *)this_00
              );
  }
  return (int)this;
}

Assistant:

Option<std::pair<Key,Val>> remove(Key const& key)
  {
    Entry* e=findEntry(key);
    if(!e) {
      return {};
    }
    e->_info.deleted=1;
    _size--;
    _deleted++;
    return some(std::pair<Key,Val>(move_if_value<Key>(e->_key), move_if_value<Val>(e->_val)));
  }